

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFuncInfoArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint32 uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  AuxArray<Js::FuncInfoEntry> *this_00;
  size_t sVar8;
  byte *current;
  int i;
  int *elements;
  AuxArray<Js::FuncInfoEntry> *result;
  int count;
  SerializedFuncInfoArray *serialized;
  ByteBlock *deserializeInto_local;
  byte *buffer_local;
  ScriptContext *scriptContext_local;
  ByteCodeBufferReader *this_local;
  
  uVar1 = *(uint32 *)(buffer + 5);
  uVar2 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar2 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1245,
                                "(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  this_00 = (AuxArray<Js::FuncInfoEntry> *)(pbVar7 + *(uint *)buffer);
  this_00->count = uVar1;
  uVar2 = *(uint *)buffer;
  sVar8 = AuxArray<Js::FuncInfoEntry>::GetDataSize(this_00);
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < uVar2 + sVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1248,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  for (current._4_4_ = 0; current._4_4_ < (int)uVar1; current._4_4_ = current._4_4_ + 1) {
    this_00[(long)current._4_4_ * 2 + 1].count =
         *(uint32 *)(buffer + (long)(current._4_4_ << 1) * 4 + 9);
    this_00[(long)current._4_4_ * 2 + 2].count =
         *(uint32 *)(buffer + (long)(current._4_4_ * 2 + 1) * 4 + 9);
  }
  return buffer + (long)(int)(uVar1 << 1) * 4 + 9;
}

Assistant:

const byte *
    DeserializeFuncInfoArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFuncInfoArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFuncInfoArray);
#endif
        auto count = serialized->count;

        Assert(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength());
        auto result = (AuxArray<FuncInfoEntry> *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto elements = (int*)(serialized+1);
        for(int i=0;i<count;++i)
        {
            result->elements[i].nestedIndex = elements[i*2];
            result->elements[i].scopeSlot = elements[i*2+1];
        }
        auto current = buffer + sizeof(serialization_alignment const SerializedFuncInfoArray) + (count * 2 * sizeof(int));
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFuncInfoArray);
#endif
        return current;
    }